

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O3

void __thiscall GGSock::FileServer::FileServer(FileServer *this)

{
  _Base_ptr p_Var1;
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> _Var2;
  
  _Var2._M_head_impl = (Impl *)operator_new(0x128);
  memset((TPort *)((long)&(_Var2._M_head_impl)->parameters + 0x10),0,0xc0);
  *(undefined8 *)&(_Var2._M_head_impl)->parameters = 0x800000004;
  *(undefined8 *)((long)&(_Var2._M_head_impl)->parameters + 8) = 0x8000000080;
  *(TPort *)((long)&(_Var2._M_head_impl)->parameters + 0x10) = 0x58ed;
  (_Var2._M_head_impl)->isListening = false;
  *(uint *)((long)&(_Var2._M_head_impl)->fileUsed + 0x18) = 0;
  p_Var1 = (_Base_ptr)((long)&(_Var2._M_head_impl)->fileInfos + 8);
  *(_Base_ptr *)((long)&(_Var2._M_head_impl)->fileInfos + 0x10) = (_Base_ptr)0x0;
  (_Var2._M_head_impl)->currentFileUpdateId = 0;
  (_Var2._M_head_impl)->currentClientUpdateId = 0;
  *(undefined8 *)&((_Var2._M_head_impl)->fileUsed).super__Bvector_base<std::allocator<bool>_> = 0;
  *(uint *)((long)&(_Var2._M_head_impl)->fileUsed + 8) = 0;
  *(_Bit_pointer *)((long)&(_Var2._M_head_impl)->fileUsed + 0x20) = (_Bit_pointer)0x0;
  *(undefined8 *)
   &((_Var2._M_head_impl)->files).
    super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
       = 0;
  *(pointer *)((long)&(_Var2._M_head_impl)->files + 8) = (pointer)0x0;
  *(pointer *)((long)&(_Var2._M_head_impl)->files + 0x10) = (pointer)0x0;
  *(undefined8 *)
   &((_Var2._M_head_impl)->clients).
    super__Vector_base<GGSock::ClientData,_std::allocator<GGSock::ClientData>_> = 0;
  *(pointer *)((long)&(_Var2._M_head_impl)->clients + 8) = (pointer)0x0;
  *(undefined8 *)((long)&(_Var2._M_head_impl)->clients + 9) = 0;
  *(undefined8 *)((long)&(_Var2._M_head_impl)->clients + 0x11) = 0;
  *(_Base_ptr *)((long)&(_Var2._M_head_impl)->fileInfos + 0x18) = p_Var1;
  *(_Base_ptr *)((long)&(_Var2._M_head_impl)->fileInfos + 0x20) = p_Var1;
  (_Var2._M_head_impl)->changedClientInfos = false;
  p_Var1 = (_Base_ptr)((long)&(_Var2._M_head_impl)->clientInfos + 8);
  *(_Base_ptr *)((long)&(_Var2._M_head_impl)->clientInfos + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&(_Var2._M_head_impl)->clientInfos + 0x18) = p_Var1;
  *(_Base_ptr *)((long)&(_Var2._M_head_impl)->clientInfos + 0x20) = p_Var1;
  *(pointer *)((long)&(_Var2._M_head_impl)->workers + 0x10) = (pointer)0x0;
  *(undefined8 *)
   &((_Var2._M_head_impl)->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_> =
       0;
  *(pointer *)((long)&(_Var2._M_head_impl)->workers + 8) = (pointer)0x0;
  *(undefined8 *)((long)&(_Var2._M_head_impl)->mutex + 0x18) = 0;
  *(undefined8 *)((long)&(_Var2._M_head_impl)->mutex + 0x20) = 0;
  *(undefined8 *)((long)&(_Var2._M_head_impl)->mutex + 8) = 0;
  *(undefined8 *)((long)&(_Var2._M_head_impl)->mutex + 0x10) = 0;
  *(size_t *)((long)&(_Var2._M_head_impl)->clientInfos + 0x28) = 0;
  *(undefined8 *)&((_Var2._M_head_impl)->mutex).super___mutex_base = 0;
  (this->m_impl)._M_t.
  super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>.
  _M_t.
  super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
  .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl = _Var2._M_head_impl;
  return;
}

Assistant:

FileServer::FileServer() : m_impl(new Impl()) {
}